

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_operators.cpp
# Opt level: O2

void __thiscall
test_vector_operators_dot_product_Test::test_vector_operators_dot_product_Test
          (test_vector_operators_dot_product_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00154590;
  return;
}

Assistant:

TEST(test_vector_operators, dot_product) {
  Vector_Dense<Scalar, 0> dynamic_vector_0 = {1.0, 0.0, 0.0};
  Vector_Dense<Scalar, 0> dynamic_vector_1 = {0.0, 1.0, 0.0};
  Vector_Dense<Scalar, 3> static_vector_0 = {1.0, 0.0, 0.0};
  Vector_Dense<Scalar, 3> static_vector_1 = {0.0, 1.0, 0.0};
  EXPECT_DOUBLE_EQ(dot_product(dynamic_vector_0, dynamic_vector_1), 0.0);
  EXPECT_DOUBLE_EQ(dot_product(dynamic_vector_0, static_vector_0), 1.0);
  EXPECT_DOUBLE_EQ(dot_product(static_vector_0, static_vector_1), 0.0);

  dynamic_vector_0 = {1.0, 2.0, 5.0};
  dynamic_vector_1 = {-2.0, -1.0, 6.0};
  static_vector_0 = {4.0, -3.0, 7.0};
  static_vector_1 = {1.0, -2.0, 2.0};
  EXPECT_DOUBLE_EQ(dot_product(dynamic_vector_0, dynamic_vector_1), 26.0);
  EXPECT_DOUBLE_EQ(dot_product(dynamic_vector_0, static_vector_0), 33.0);
  EXPECT_DOUBLE_EQ(dot_product(static_vector_0, static_vector_1), 24.0);

  EXPECT_DEATH(dot_product(dynamic_vector_0, Vector_Dense<Scalar, 0>({1.0, 2.0})), "./*");
  EXPECT_DEATH(dot_product(static_vector_0, Vector_Dense<Scalar, 0>({1.0, 2.0})), "./*");
}